

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int collect_unknown_extension
              (ptls_t *tls,uint16_t type,uint8_t *src,uint8_t *end,ptls_raw_extension_t *slots)

{
  short sVar1;
  undefined6 in_register_00000032;
  ulong uVar2;
  
  sVar1 = *(short *)end;
  if (sVar1 != -1) {
    uVar2 = 0xffffffffffffffff;
    do {
      if (uVar2 == 0xf) {
        __assert_fail("i < MAX_UNKNOWN_EXTENSIONS",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0xb6a,
                      "int collect_unknown_extension(ptls_t *, uint16_t, const uint8_t *, const uint8_t *const, ptls_raw_extension_t *)"
                     );
      }
      if (sVar1 == (short)tls) {
        return 0x2f;
      }
      sVar1 = *(short *)((long)end + 0x18);
      end = (uint8_t *)((long)end + 0x18);
      uVar2 = uVar2 + 1;
    } while (sVar1 != -1);
    if (0xe < uVar2) {
      return 0;
    }
  }
  *(short *)end = (short)tls;
  *(long *)((long)end + 8) = CONCAT62(in_register_00000032,type);
  *(long *)((long)end + 0x10) = (long)src - CONCAT62(in_register_00000032,type);
  *(short *)((long)end + 0x18) = -1;
  return 0;
}

Assistant:

static int collect_unknown_extension(ptls_t *tls, uint16_t type, const uint8_t *src, const uint8_t *const end,
                                     ptls_raw_extension_t *slots)
{
    size_t i;
    for (i = 0; slots[i].type != UINT16_MAX; ++i) {
        assert(i < MAX_UNKNOWN_EXTENSIONS);
        if (slots[i].type == type)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
    }
    if (i < MAX_UNKNOWN_EXTENSIONS) {
        slots[i].type = type;
        slots[i].data = ptls_iovec_init(src, end - src);
        slots[i + 1].type = UINT16_MAX;
    }
    return 0;
}